

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.h
# Opt level: O0

SampledSpectrum __thiscall
pbrt::BlackbodySpectrum::Sample(BlackbodySpectrum *this,SampledWavelengths *lambda)

{
  Float *pFVar1;
  undefined8 in_RSI;
  SampledWavelengths *in_RDI;
  Float FVar2;
  int i;
  SampledSpectrum s;
  float in_stack_ffffffffffffffcc;
  Float T;
  array<float,_4> local_10;
  
  SampledSpectrum::SampledSpectrum((SampledSpectrum *)0x82ba12);
  for (T = 0.0; (int)T < 4; T = (Float)((int)T + 1)) {
    SampledWavelengths::operator[](in_RDI,(int)in_stack_ffffffffffffffcc);
    FVar2 = Blackbody((Float)in_RSI,T);
    in_stack_ffffffffffffffcc = FVar2 * (in_RDI->lambda).values[1];
    pFVar1 = SampledSpectrum::operator[]((SampledSpectrum *)in_RDI,(int)in_stack_ffffffffffffffcc);
    *pFVar1 = in_stack_ffffffffffffffcc;
  }
  return (array<float,_4>)(array<float,_4>)local_10.values;
}

Assistant:

Sample(const SampledWavelengths &lambda) const {
        SampledSpectrum s;
        for (int i = 0; i < NSpectrumSamples; ++i)
            s[i] = Blackbody(lambda[i], T) * normalizationFactor;
        return s;
    }